

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_bpf_reinit__internal(ma_bpf_config *pConfig,void *pHeap,ma_bpf *pBPF,ma_bool32 isNew)

{
  uint uVar1;
  ma_result mVar2;
  int in_ECX;
  ma_bpf2_config *in_RDX;
  void *in_RSI;
  ma_bpf2_config *in_RDI;
  size_t bpf2HeapSizeInBytes;
  double q;
  ma_bpf2_config bpf2Config;
  ma_bpf_heap_layout heapLayout;
  ma_uint32 ibpf2;
  ma_uint32 bpf2Count;
  ma_result result;
  double in_stack_ffffffffffffff58;
  double in_stack_ffffffffffffff60;
  ma_uint32 in_stack_ffffffffffffff6c;
  ma_uint32 in_stack_ffffffffffffff70;
  ma_format in_stack_ffffffffffffff74;
  ma_bpf_heap_layout *in_stack_ffffffffffffff80;
  ma_bpf_config *in_stack_ffffffffffffff88;
  size_t local_60;
  long local_58;
  uint uVar3;
  ma_result in_stack_ffffffffffffffb8;
  ma_result local_24;
  
  if ((in_RDX == (ma_bpf2_config *)0x0) || (in_RDI == (ma_bpf2_config *)0x0)) {
    local_24 = MA_INVALID_ARGS;
  }
  else if ((in_RDI->format == ma_format_f32) || (in_RDI->format == ma_format_s16)) {
    if ((in_RDX->format == ma_format_unknown) || (in_RDX->format == in_RDI->format)) {
      if ((in_RDX->channels == 0) || (in_RDX->channels == in_RDI->channels)) {
        if (*(uint *)&in_RDI->q < 9) {
          if (((ulong)in_RDI->q & 1) == 0) {
            uVar1 = *(uint *)&in_RDI->q >> 1;
            if ((in_ECX == 0) && (in_RDX->sampleRate != uVar1)) {
              local_24 = MA_INVALID_OPERATION;
            }
            else {
              if (in_ECX == 0) {
                if (&local_60 != (size_t *)0x0) {
                  memset(&local_60,0,0x10);
                }
              }
              else {
                in_stack_ffffffffffffffb8 =
                     ma_bpf_get_heap_layout(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
                if (in_stack_ffffffffffffffb8 != MA_SUCCESS) {
                  return in_stack_ffffffffffffffb8;
                }
                in_RDX->q = (double)in_RSI;
                if ((in_RSI != (void *)0x0) && (local_60 != 0)) {
                  memset(in_RSI,0,local_60);
                }
                in_RDX->cutoffFrequency = (double)((long)in_RSI + local_58);
              }
              for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
                ma_bpf2_config_init(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                                    in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                                    in_stack_ffffffffffffff58);
                if (in_ECX == 0) {
                  mVar2 = ma_bpf2_reinit(in_RDX,(ma_bpf2 *)(ulong)(uint)in_stack_ffffffffffffffb8);
                }
                else {
                  mVar2 = ma_bpf2_get_heap_size
                                    ((ma_bpf2_config *)CONCAT44(in_ECX,in_stack_ffffffffffffffb8),
                                     (size_t *)CONCAT44(uVar1,uVar3));
                  if (mVar2 == MA_SUCCESS) {
                    mVar2 = ma_bpf2_init_preallocated(in_RDI,in_RSI,(ma_bpf2 *)in_RDX);
                  }
                }
                if (mVar2 != MA_SUCCESS) {
                  return mVar2;
                }
                in_stack_ffffffffffffffb8 = MA_SUCCESS;
              }
              in_RDX->sampleRate = uVar1;
              in_RDX->format = in_RDI->format;
              in_RDX->channels = in_RDI->channels;
              local_24 = MA_SUCCESS;
            }
          }
          else {
            local_24 = MA_INVALID_ARGS;
          }
        }
        else {
          local_24 = MA_INVALID_ARGS;
        }
      }
      else {
        local_24 = MA_INVALID_OPERATION;
      }
    }
    else {
      local_24 = MA_INVALID_OPERATION;
    }
  }
  else {
    local_24 = MA_INVALID_ARGS;
  }
  return local_24;
}

Assistant:

static ma_result ma_bpf_reinit__internal(const ma_bpf_config* pConfig, void* pHeap, ma_bpf* pBPF, ma_bool32 isNew)
{
    ma_result result;
    ma_uint32 bpf2Count;
    ma_uint32 ibpf2;
    ma_bpf_heap_layout heapLayout;  /* Only used if isNew is true. */

    if (pBPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pBPF->format != ma_format_unknown && pBPF->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pBPF->channels != 0 && pBPF->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    /* We must have an even number of order. */
    if ((pConfig->order & 0x1) != 0) {
        return MA_INVALID_ARGS;
    }

    bpf2Count = pConfig->order / 2;

    /* The filter order can't change between reinits. */
    if (!isNew) {
        if (pBPF->bpf2Count != bpf2Count) {
            return MA_INVALID_OPERATION;
        }
    }

    if (isNew) {
        result = ma_bpf_get_heap_layout(pConfig, &heapLayout);
        if (result != MA_SUCCESS) {
            return result;
        }

        pBPF->_pHeap = pHeap;
        MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

        pBPF->pBPF2 = (ma_bpf2*)ma_offset_ptr(pHeap, heapLayout.bpf2Offset);
    } else {
        MA_ZERO_OBJECT(&heapLayout);
    }

    for (ibpf2 = 0; ibpf2 < bpf2Count; ibpf2 += 1) {
        ma_bpf2_config bpf2Config;
        double q;

        /* TODO: Calculate Q to make this a proper Butterworth filter. */
        q = 0.707107;

        bpf2Config = ma_bpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, q);

        if (isNew) {
            size_t bpf2HeapSizeInBytes;

            result = ma_bpf2_get_heap_size(&bpf2Config, &bpf2HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_bpf2_init_preallocated(&bpf2Config, ma_offset_ptr(pHeap, heapLayout.bpf2Offset + (sizeof(ma_bpf2) * bpf2Count) + (ibpf2 * bpf2HeapSizeInBytes)), &pBPF->pBPF2[ibpf2]);
            }
        } else {
            result = ma_bpf2_reinit(&bpf2Config, &pBPF->pBPF2[ibpf2]);
        }

        if (result != MA_SUCCESS) {
            return result;
        }
    }

    pBPF->bpf2Count = bpf2Count;
    pBPF->format    = pConfig->format;
    pBPF->channels  = pConfig->channels;

    return MA_SUCCESS;
}